

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GLSLangUtils.cpp
# Opt level: O1

EShLanguage Diligent::GLSLangUtils::anon_unknown_3::ShaderTypeToShLanguage(SHADER_TYPE ShaderType)

{
  string msg;
  string local_28;
  
  if ((int)ShaderType < 0x100) {
    if ((int)ShaderType < 0x10) {
      switch(ShaderType) {
      case SHADER_TYPE_VERTEX:
        return EShLangVertex;
      case SHADER_TYPE_PIXEL:
        return EShLangFragment;
      case SHADER_TYPE_GEOMETRY:
        return EShLangGeometry;
      case SHADER_TYPE_HULL:
        return EShLangTessControl;
      }
    }
    else if ((int)ShaderType < 0x40) {
      if (ShaderType == SHADER_TYPE_DOMAIN) {
        return EShLangTessEvaluation;
      }
      if (ShaderType == SHADER_TYPE_COMPUTE) {
        return EShLangCompute;
      }
    }
    else {
      if (ShaderType == SHADER_TYPE_AMPLIFICATION) {
        return EShLangTask;
      }
      if (ShaderType == SHADER_TYPE_MESH) {
        return EShLangMesh;
      }
    }
  }
  else if ((int)ShaderType < 0x800) {
    if (ShaderType == SHADER_TYPE_RAY_GEN) {
      return EShLangRayGen;
    }
    if (ShaderType == SHADER_TYPE_RAY_MISS) {
      return EShLangMiss;
    }
    if (ShaderType == SHADER_TYPE_RAY_CLOSEST_HIT) {
      return EShLangClosestHit;
    }
  }
  else if ((int)ShaderType < 0x2000) {
    if (ShaderType == SHADER_TYPE_RAY_ANY_HIT) {
      return EShLangAnyHit;
    }
    if (ShaderType == SHADER_TYPE_RAY_INTERSECTION) {
      return EShLangIntersect;
    }
  }
  else {
    if (ShaderType == SHADER_TYPE_CALLABLE) {
      return EShLangCallable;
    }
    if (ShaderType == SHADER_TYPE_LAST) {
      FormatString<char[24]>(&local_28,(char (*) [24])"Unsupported shader type");
      DebugAssertionFailed
                (local_28._M_dataplus._M_p,"ShaderTypeToShLanguage",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/ShaderTools/src/GLSLangUtils.cpp"
                 ,0x66);
      goto LAB_0035e7ef;
    }
  }
  FormatString<char[23]>(&local_28,(char (*) [23])"Unexpected shader type");
  DebugAssertionFailed
            (local_28._M_dataplus._M_p,"ShaderTypeToShLanguage",
             "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/ShaderTools/src/GLSLangUtils.cpp"
             ,0x69);
LAB_0035e7ef:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_28._M_dataplus._M_p != &local_28.field_2) {
    operator_delete(local_28._M_dataplus._M_p,local_28.field_2._M_allocated_capacity + 1);
  }
  return EShLangCount;
}

Assistant:

EShLanguage ShaderTypeToShLanguage(SHADER_TYPE ShaderType)
{
    static_assert(SHADER_TYPE_LAST == 0x4000, "Please handle the new shader type in the switch below");
    switch (ShaderType)
    {
        // clang-format off
        case SHADER_TYPE_VERTEX:           return EShLangVertex;
        case SHADER_TYPE_HULL:             return EShLangTessControl;
        case SHADER_TYPE_DOMAIN:           return EShLangTessEvaluation;
        case SHADER_TYPE_GEOMETRY:         return EShLangGeometry;
        case SHADER_TYPE_PIXEL:            return EShLangFragment;
        case SHADER_TYPE_COMPUTE:          return EShLangCompute;
        case SHADER_TYPE_AMPLIFICATION:    return EShLangTaskNV;
        case SHADER_TYPE_MESH:             return EShLangMeshNV;
        case SHADER_TYPE_RAY_GEN:          return EShLangRayGen;
        case SHADER_TYPE_RAY_MISS:         return EShLangMiss;
        case SHADER_TYPE_RAY_CLOSEST_HIT:  return EShLangClosestHit;
        case SHADER_TYPE_RAY_ANY_HIT:      return EShLangAnyHit;
        case SHADER_TYPE_RAY_INTERSECTION: return EShLangIntersect;
        case SHADER_TYPE_CALLABLE:         return EShLangCallable;
        // clang-format on
        case SHADER_TYPE_TILE:
            UNEXPECTED("Unsupported shader type");
            return EShLangCount;
        default:
            UNEXPECTED("Unexpected shader type");
            return EShLangCount;
    }
}